

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StreamExpressionWithRangeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionWithRangeSyntax,slang::parsing::Token&,slang::syntax::ElementSelectSyntax&>
          (BumpAllocator *this,Token *args,ElementSelectSyntax *args_1)

{
  Token withKeyword;
  StreamExpressionWithRangeSyntax *this_00;
  ElementSelectSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (StreamExpressionWithRangeSyntax *)allocate(this,0x28,8);
  withKeyword.kind = args->kind;
  withKeyword._2_1_ = args->field_0x2;
  withKeyword.numFlags.raw = (args->numFlags).raw;
  withKeyword.rawLen = args->rawLen;
  withKeyword.info = args->info;
  slang::syntax::StreamExpressionWithRangeSyntax::StreamExpressionWithRangeSyntax
            (this_00,withKeyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }